

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O2

ssize_t __thiscall
Text::splice(Text *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,size_t __len,
            uint __flags)

{
  size_type sVar1;
  long lVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  Point PVar6;
  const_iterator inserted_begin;
  const_iterator inserted_end;
  size_t sVar7;
  pointer puVar8;
  uint32_t splice_start;
  uint in_register_00000034;
  ulong uVar9;
  size_t i;
  ulong uVar10;
  ClipResult CVar11;
  undefined4 in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int local_48;
  Point local_40;
  Point local_38;
  
  local_40.column = in_register_00000034;
  local_40.row = __fdin;
  local_38 = (Point)__offin;
  CVar11 = clip_position(this,local_40);
  splice_start = CVar11.offset;
  PVar6 = Point::traverse(&local_40,&local_38);
  CVar11 = clip_position(this,PVar6);
  sVar1 = (this->content)._M_string_length;
  inserted_begin = TextSlice::begin_abi_cxx11_((TextSlice *)&__flags);
  inserted_end = TextSlice::end_abi_cxx11_((TextSlice *)&__flags);
  splice_vector<std::__cxx11::u16string>
            (&this->content,splice_start,CVar11.offset - splice_start,
             (const_iterator)inserted_begin._M_current,(const_iterator)inserted_end._M_current);
  lVar2 = *(long *)(CONCAT44(in_stack_0000000c,__flags) + 0x20);
  splice_vector<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&this->line_offsets,local_40.row + 1,local_38.row,
             (uint *)(lVar2 + (ulong)in_stack_00000010 * 4 + 4),
             (uint *)(lVar2 + (ulong)in_stack_00000018 * 4 + 4));
  uVar4 = local_40.row;
  uVar5 = local_40.row + 1;
  PVar6 = TextSlice::extent((TextSlice *)&__flags);
  uVar9 = (ulong)(uVar4 + PVar6.row + 1);
  sVar7 = TextSlice::start_offset((TextSlice *)&__flags);
  puVar8 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar10 = (ulong)uVar5; uVar10 < uVar9; uVar10 = uVar10 + 1) {
    puVar3 = puVar8 + uVar10;
    *puVar3 = *puVar3 + (splice_start - (int)sVar7);
  }
  local_48 = (int)sVar1;
  uVar5 = (int)(this->content)._M_string_length - local_48;
  puVar3 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = puVar8 + uVar9; puVar8 != puVar3; puVar8 = puVar8 + 1) {
    *puVar8 = *puVar8 + uVar5;
  }
  return (ulong)uVar5;
}

Assistant:

void Text::splice(Point start, Point deletion_extent, TextSlice inserted_slice) {
  uint32_t content_splice_start = offset_for_position(start);
  uint32_t content_splice_end = offset_for_position(start.traverse(deletion_extent));
  uint32_t original_content_size = content.size();
  splice_vector(
    content,
    content_splice_start,
    content_splice_end - content_splice_start,
    inserted_slice.begin(),
    inserted_slice.end()
  );

  splice_vector(
    line_offsets,
    start.row + 1,
    deletion_extent.row,
    inserted_slice.text->line_offsets.begin() + inserted_slice.start_position.row + 1,
    inserted_slice.text->line_offsets.begin() + inserted_slice.end_position.row + 1
  );

  uint32_t inserted_newlines_start = start.row + 1;
  uint32_t inserted_newlines_end = start.row + inserted_slice.extent().row + 1;
  int64_t inserted_line_offsets_delta = content_splice_start - static_cast<int64_t>(inserted_slice.start_offset());
  for (size_t i = inserted_newlines_start; i < inserted_newlines_end; i++) {
    line_offsets[i] += inserted_line_offsets_delta;
  }

  uint32_t content_size = content.size();
  int64_t trailing_line_offsets_delta = static_cast<int64_t>(content_size) - original_content_size;
  for (auto iter = line_offsets.begin() + inserted_newlines_end; iter != line_offsets.end(); ++iter) {
    *iter += trailing_line_offsets_delta;
  }
}